

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  uint32_t *puVar7;
  char *pcVar8;
  string *psVar9;
  size_t __n;
  void *__src;
  uint8_t *puVar10;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  ServiceDescriptorProto *value_01;
  FieldDescriptorProto *value_02;
  FileOptions *value_03;
  SourceCodeInfo *value_04;
  UnknownFieldSet *unknown_fields;
  void *__dest;
  int local_ac;
  int n_6;
  int i_6;
  int n_5;
  int i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  string *s;
  int local_70;
  int n;
  int i;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FileDescriptorProto *this_local;
  ptrdiff_t size;
  EpsCopyOutputStream *local_28;
  
  puVar7 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar7;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    _internal_name_abi_cxx11_(this);
    pcVar8 = (char *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar3,SERIALIZE,"google.protobuf.FileDescriptorProto.name");
    psVar9 = _internal_name_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,psVar9,target);
  }
  if ((uVar1 & 2) != 0) {
    _internal_package_abi_cxx11_(this);
    pcVar8 = (char *)std::__cxx11::string::data();
    _internal_package_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar3,SERIALIZE,"google.protobuf.FileDescriptorProto.package");
    psVar9 = _internal_package_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,psVar9,(uint8_t *)stream_local);
  }
  local_70 = 0;
  iVar3 = _internal_dependency_size(this);
  for (; local_70 < iVar3; local_70 = local_70 + 1) {
    psVar9 = _internal_dependency_abi_cxx11_(this,local_70);
    pcVar8 = (char *)std::__cxx11::string::data();
    iVar4 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar4,SERIALIZE,"google.protobuf.FileDescriptorProto.dependency");
    __n = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)__n < 0x80) {
      puVar10 = stream->end_;
      iVar4 = io::EpsCopyOutputStream::TagSize(0x18);
      bVar2 = (long)(puVar10 + (-(long)iVar4 - (long)stream_local) + 0xf) < (long)__n;
    }
    if (bVar2) {
      local_28 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline
                           (stream,3,psVar9,(uint8_t *)stream_local);
    }
    else {
      *(undefined1 *)&stream_local->end_ = 0x1a;
      __dest = (void *)((long)&stream_local->end_ + 2);
      *(char *)((long)&stream_local->end_ + 1) = (char)__n;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,__n);
      local_28 = (EpsCopyOutputStream *)((long)__dest + __n);
    }
    stream_local = local_28;
  }
  i_2 = 0;
  uVar5 = _internal_message_type_size(this);
  for (; i_2 < uVar5; i_2 = i_2 + 1) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _internal_message_type(this,i_2);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage<google::protobuf::DescriptorProto>
                             (4,value,puVar10,stream);
  }
  i_3 = 0;
  uVar5 = _internal_enum_type_size(this);
  for (; i_3 < uVar5; i_3 = i_3 + 1) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _internal_enum_type(this,i_3);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::
                   InternalWriteMessage<google::protobuf::EnumDescriptorProto>
                             (5,value_00,puVar10,stream);
  }
  i_4 = 0;
  uVar5 = _internal_service_size(this);
  for (; i_4 < uVar5; i_4 = i_4 + 1) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _internal_service(this,i_4);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::
                   InternalWriteMessage<google::protobuf::ServiceDescriptorProto>
                             (6,value_01,puVar10,stream);
  }
  i_5 = 0;
  uVar5 = _internal_extension_size(this);
  for (; (uint)i_5 < uVar5; i_5 = i_5 + 1) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _internal_extension(this,i_5);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::
                   InternalWriteMessage<google::protobuf::FieldDescriptorProto>
                             (7,value_02,puVar10,stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_03 = _Internal::options(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage<google::protobuf::FileOptions>
                             (8,value_03,puVar10,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_04 = _Internal::source_code_info(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage<google::protobuf::SourceCodeInfo>
                             (9,value_04,puVar10,stream);
  }
  i_6 = 0;
  iVar3 = _internal_public_dependency_size(this);
  for (; i_6 < iVar3; i_6 = i_6 + 1) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar6 = _internal_public_dependency(this,i_6);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArray(10,iVar6,puVar10);
  }
  local_ac = 0;
  iVar3 = _internal_weak_dependency_size(this);
  for (; local_ac < iVar3; local_ac = local_ac + 1) {
    puVar10 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar6 = _internal_weak_dependency(this,local_ac);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArray(0xb,iVar6,puVar10);
  }
  if ((uVar1 & 4) != 0) {
    _internal_syntax_abi_cxx11_(this);
    pcVar8 = (char *)std::__cxx11::string::data();
    _internal_syntax_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar8,iVar3,SERIALIZE,"google.protobuf.FileDescriptorProto.syntax");
    psVar9 = _internal_syntax_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,0xc,psVar9,(uint8_t *)stream_local);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* FileDescriptorProto::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}